

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<short,unsigned_int>(void)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> bits;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_00;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_01;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_02;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  uint u2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  short t;
  uint u;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  short in_stack_fffffffffffffe9e;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffea0;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffea4;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffea6;
  undefined2 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeaa;
  undefined4 in_stack_fffffffffffffeac;
  undefined2 in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffeb4;
  undefined2 in_stack_fffffffffffffeb6;
  short local_12;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_a;
  byte local_7;
  short local_6;
  uint local_4;
  
  local_4 = 0;
  local_6 = 0;
  local_7 = 0;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             (uint *)CONCAT26(in_stack_fffffffffffffe9e,
                              CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_10,&local_4);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  local_7 = (local_7 ^ 0xff) & 1;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (short *)CONCAT44(in_stack_fffffffffffffeac,
                               CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (uint *)CONCAT44(in_stack_fffffffffffffeac,
                              CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)));
  local_a.m_int = local_12;
  SafeInt::operator_cast_to_unsigned_int
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             in_stack_fffffffffffffeb4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator*(in_stack_fffffffffffffea0.m_int,in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  rhs.m_int._2_2_ = in_stack_fffffffffffffea6.m_int;
  rhs.m_int._0_2_ = in_stack_fffffffffffffea4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),rhs);
  local_4 = 1;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             in_stack_fffffffffffffeb4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  rhs_00.m_int._2_2_ = in_stack_fffffffffffffeb6;
  rhs_00.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),rhs_00);
  local_4 = 1;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             in_stack_fffffffffffffeb4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator/(in_stack_fffffffffffffea0.m_int,in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  i.m_int._2_2_ = in_stack_fffffffffffffeb6;
  i.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),i);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             in_stack_fffffffffffffeb4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator+(in_stack_fffffffffffffea0.m_int,in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  rhs_01.m_int._2_2_ = in_stack_fffffffffffffeb6;
  rhs_01.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),rhs_01);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  local_4 = 0;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             in_stack_fffffffffffffeb4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator-(in_stack_fffffffffffffea0.m_int,in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  rhs_02.m_int._2_2_ = in_stack_fffffffffffffeb6;
  rhs_02.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),rhs_02);
  local_4 = 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffeb6,
                      CONCAT24(in_stack_fffffffffffffeb4.m_int,
                               CONCAT22(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0))),
             (int *)CONCAT44(in_stack_fffffffffffffeac,
                             CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             CONCAT22(in_stack_fffffffffffffea6.m_int,in_stack_fffffffffffffea4.m_int));
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  bits_01.m_int._2_2_ = in_stack_fffffffffffffeb2;
  bits_01.m_int._0_2_ = in_stack_fffffffffffffeb0;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),bits_01);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator<<(in_stack_fffffffffffffe9e,in_stack_fffffffffffffea0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  bits.m_int._2_2_ = in_stack_fffffffffffffea6.m_int;
  bits.m_int._0_2_ = in_stack_fffffffffffffea4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),bits);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),
             CONCAT22(in_stack_fffffffffffffea6.m_int,in_stack_fffffffffffffea4.m_int));
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  bits_02.m_int._2_2_ = in_stack_fffffffffffffeb2;
  bits_02.m_int._0_2_ = in_stack_fffffffffffffeb0;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),bits_02);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator>>(in_stack_fffffffffffffe9e,in_stack_fffffffffffffea0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  bits_00.m_int._2_2_ = in_stack_fffffffffffffea6.m_int;
  bits_00.m_int._0_2_ = in_stack_fffffffffffffea4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),bits_00);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
             in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator&(in_stack_fffffffffffffe9e,in_stack_fffffffffffffea0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffea6.m_int,
                                   CONCAT24(in_stack_fffffffffffffea4.m_int,
                                            in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
             in_stack_fffffffffffffea6);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  rhs_03.m_int._2_2_ = in_stack_fffffffffffffeb6;
  rhs_03.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),rhs_03);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
             in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator|(in_stack_fffffffffffffe9e,in_stack_fffffffffffffea0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffea6.m_int,
                                   CONCAT24(in_stack_fffffffffffffea4.m_int,
                                            in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
             in_stack_fffffffffffffea6);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  rhs_04.m_int._2_2_ = in_stack_fffffffffffffeb6;
  rhs_04.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),rhs_04);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
             in_stack_fffffffffffffea4);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffea6.m_int,
                                CONCAT24(in_stack_fffffffffffffea4.m_int,
                                         in_stack_fffffffffffffea0.m_int)));
  operator^(in_stack_fffffffffffffe9e,in_stack_fffffffffffffea0);
  local_6 = SafeInt::operator_cast_to_short
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffea6.m_int,
                                   CONCAT24(in_stack_fffffffffffffea4.m_int,
                                            in_stack_fffffffffffffea0.m_int)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe9e,
                      CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
             in_stack_fffffffffffffea6);
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffea6.m_int,
                      CONCAT24(in_stack_fffffffffffffea4.m_int,in_stack_fffffffffffffea0.m_int)),
             CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
  rhs_05.m_int._2_2_ = in_stack_fffffffffffffeb6;
  rhs_05.m_int._0_2_ = in_stack_fffffffffffffeb4.m_int;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffeac,
                      CONCAT22(in_stack_fffffffffffffeaa,in_stack_fffffffffffffea8)),rhs_05);
  local_7 = operator<(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator<(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0.m_int);
  local_7 = operator<(0x17ceeb,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                               )0x0);
  local_7 = operator<(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator<=(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       0x17cf76);
  local_7 = operator<=(in_stack_fffffffffffffea0.m_int,in_stack_fffffffffffffea6);
  local_7 = operator<=(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator>(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator>((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      0x17d028);
  local_7 = operator>(in_stack_fffffffffffffea0.m_int,in_stack_fffffffffffffea6);
  local_7 = operator>(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator>=(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator>=(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0.m_int);
  local_7 = operator>=(0x17d101,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                 )0x0);
  local_7 = operator>=(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator==(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0);
  local_7 = operator==((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       0x17d18c);
  local_7 = operator==(0x17d1b3,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                 )0x0);
  operator==(local_a,local_10);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}